

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O1

int __thiscall
CEditor::DoButton_Editor
          (CEditor *this,void *pID,char *pText,int Checked,CUIRect *pRect,int Flags,char *pToolTip)

{
  void *pvVar1;
  int iVar2;
  char *pText_00;
  long in_FS_OFFSET;
  undefined8 uVar3;
  anon_union_4_2_94730227_for_vector4_base<float>_1 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (Checked < 0) {
    local_48.x = 0.0;
    uStack_44 = 0;
    uVar3 = 0x3f00000000000000;
  }
  else {
    pvVar1 = (this->m_UI).m_pHotItem;
    if (Checked == 0) {
      if (pvVar1 == pID) {
        uVar3 = 0x3f4000003f800000;
      }
      else {
        uVar3 = 0x3f0000003f800000;
      }
      local_48.x = 1.0;
      uStack_44 = 0x3f800000;
    }
    else {
      if (pvVar1 == pID) {
        uVar3 = 0x3f40000000000000;
      }
      else {
        uVar3 = 0x3f00000000000000;
      }
      local_48.x = 1.0;
      uStack_44 = 0;
    }
  }
  uStack_40 = (undefined4)uVar3;
  uStack_3c = (undefined4)((ulong)uVar3 >> 0x20);
  CUIRect::Draw(pRect,(vec4 *)&local_48,3.0,0xf);
  iVar2 = 5;
  CUI::DoLabel(&this->m_UI,pRect,pText,10.0,5,-1.0,true);
  iVar2 = DoButton_Editor_Common(this,pID,pText_00,iVar2,pRect,Flags,pToolTip);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int CEditor::DoButton_Editor(const void *pID, const char *pText, int Checked, const CUIRect *pRect, int Flags, const char *pToolTip)
{
	pRect->Draw(GetButtonColor(pID, Checked), 3.0f);
	UI()->DoLabel(pRect, pText, 10.0f, TEXTALIGN_MC);
	return DoButton_Editor_Common(pID, pText, Checked, pRect, Flags, pToolTip);
}